

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

int sf_max(GlobalVars *gv,lword addr,lword *res)

{
  lword *in_RDX;
  int *in_RSI;
  lword in_RDI;
  lword val2;
  lword val1;
  int abs2;
  int abs1;
  undefined8 local_38;
  lword *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  term_two_exp(in_RDI,in_RSI,in_RDX,
               (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0);
  if ((long)in_stack_ffffffffffffffd0 < local_38) {
    *in_RDX = local_38;
    local_4 = in_stack_ffffffffffffffd8;
  }
  else {
    *in_RDX = (lword)in_stack_ffffffffffffffd0;
    local_4 = in_stack_ffffffffffffffdc;
  }
  return local_4;
}

Assistant:

static int sf_max(struct GlobalVars *gv,lword addr,lword *res)
{
  int abs1,abs2;
  lword val1,val2;

  term_two_exp(addr,&abs1,&val1,&abs2,&val2);
  if (val1 < val2) {
    *res = val2;
    return abs2;
  }
  *res = val1;
  return abs1;
}